

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

void __thiscall ThreadedReplayer::enqueue_work_item(ThreadedReplayer *this,PipelineWorkItem *item)

{
  uint uVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  PipelineWorkItem *item_local;
  ThreadedReplayer *this_local;
  
  lock._M_device = (mutex_type *)item;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->pipeline_work_queue_mutex);
  std::queue<PipelineWorkItem,_std::deque<PipelineWorkItem,_std::allocator<PipelineWorkItem>_>_>::
  push(&this->pipeline_work_queue,(value_type *)lock._M_device);
  std::condition_variable::notify_one();
  uVar1 = ((lock._M_device)->super___mutex_base)._M_mutex.__data.__kind;
  this->queued_count[uVar1] = this->queued_count[uVar1] + 1;
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void enqueue_work_item(const PipelineWorkItem &item)
	{
		lock_guard<mutex> lock(pipeline_work_queue_mutex);
		pipeline_work_queue.push(item);
		work_available_condition.notify_one();
		queued_count[item.memory_context_index]++;
	}